

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RedirectedStreams::~RedirectedStreams(RedirectedStreams *this)

{
  RedirectedStdErr *in_RDI;
  RedirectedStdErr *in_stack_ffffffffffffffa8;
  string local_48 [32];
  string local_28 [40];
  
  RedirectedStdOut::str_abi_cxx11_((RedirectedStdOut *)in_stack_ffffffffffffffa8);
  std::__cxx11::string::operator+=
            ((string *)(in_RDI->m_rss).super_NonCopyable._vptr_NonCopyable,local_28);
  std::__cxx11::string::~string(local_28);
  RedirectedStdErr::str_abi_cxx11_(in_stack_ffffffffffffffa8);
  std::__cxx11::string::operator+=((string *)(in_RDI->m_rss).m_index,local_48);
  std::__cxx11::string::~string(local_48);
  RedirectedStdErr::~RedirectedStdErr(in_RDI);
  RedirectedStdOut::~RedirectedStdOut((RedirectedStdOut *)in_RDI);
  return;
}

Assistant:

RedirectedStreams::~RedirectedStreams() {
        m_redirectedCout += m_redirectedStdOut.str();
        m_redirectedCerr += m_redirectedStdErr.str();
    }